

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O0

void __thiscall wasm::OptimizeInstructions::visitLocalSet(OptimizeInstructions *this,LocalSet *curr)

{
  bool bVar1;
  Function *this_00;
  PassOptions *pPVar2;
  bool local_39;
  PassOptions *passOptions;
  RefAs *local_20;
  RefAs *as;
  LocalSet *curr_local;
  OptimizeInstructions *this_local;
  
  as = (RefAs *)curr;
  curr_local = (LocalSet *)this;
  local_20 = Expression::dynCast<wasm::RefAs>(curr->value);
  if (local_20 != (RefAs *)0x0) {
    local_39 = false;
    if (local_20->op == RefAsNonNull) {
      this_00 = Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                ::getFunction(&(this->
                               super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                               ).
                               super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                               .
                               super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                             );
      passOptions = (PassOptions *)Function::getLocalType(this_00,as->op);
      local_39 = wasm::Type::isNullable((Type *)&passOptions);
    }
    if (local_39 != false) {
      bVar1 = LocalSet::isTee((LocalSet *)as);
      if (bVar1) {
        as->value = local_20->value;
        LocalSet::finalize((LocalSet *)as);
        local_20->value = (Expression *)as;
        RefAs::finalize(local_20);
        replaceCurrent(this,(Expression *)local_20);
      }
      else {
        pPVar2 = Pass::getPassOptions((Pass *)this);
        if (((pPVar2->ignoreImplicitTraps & 1U) != 0) || ((pPVar2->trapsNeverHappen & 1U) != 0)) {
          as->value = local_20->value;
        }
      }
    }
  }
  return;
}

Assistant:

void visitLocalSet(LocalSet* curr) {
    // Interactions between local.set/tee and ref.as_non_null can be optimized
    // in some cases, by removing or moving the ref.as_non_null operation.
    if (auto* as = curr->value->dynCast<RefAs>()) {
      if (as->op == RefAsNonNull &&
          getFunction()->getLocalType(curr->index).isNullable()) {
        //   (local.tee (ref.as_non_null ..))
        // =>
        //   (ref.as_non_null (local.tee ..))
        //
        // The reordering allows the ref.as to be potentially optimized further
        // based on where the value flows to.
        if (curr->isTee()) {
          curr->value = as->value;
          curr->finalize();
          as->value = curr;
          as->finalize();
          replaceCurrent(as);
          return;
        }

        // Otherwise, if this is not a tee, then no value falls through. The
        // ref.as_non_null acts as a null check here, basically. If we are
        // ignoring such traps, we can remove it.
        auto& passOptions = getPassOptions();
        if (passOptions.ignoreImplicitTraps || passOptions.trapsNeverHappen) {
          curr->value = as->value;
        }
      }
    }
  }